

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O0

void u_to_u8_test(int line,UTF_US16 *str1,UTF_S8 *str2,bool ok)

{
  bool bVar1;
  UTF_RET UVar2;
  int iVar3;
  char16_t *uj16;
  size_type uj16size;
  uchar *uj8a;
  size_type sVar4;
  UTF_UC8 local_148 [8];
  UTF_UC8 buf [256];
  UTF_US8 tmp;
  bool ok_local;
  UTF_S8 *str2_local;
  UTF_US16 *str1_local;
  int line_local;
  
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                *)(buf + 0xf8));
  bVar1 = UTF_u_to_u8<(char)63>
                    (str1,(basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)(buf + 0xf8));
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)(buf + 0xf8),
                          (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)str2);
  UTF_test(line,bVar1);
  uj16 = std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
         ::c_str(str1);
  uj16size = std::__cxx11::
             basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                       (str1);
  UVar2 = UTF_uj16_to_uj8(uj16,uj16size,local_148,0x100);
  UTF_test(line,UVar2 == UTF_SUCCESS);
  uj8a = std::__cxx11::
         basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
         ::c_str((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                  *)(buf + 0xf8));
  sVar4 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::size((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                  *)(buf + 0xf8));
  iVar3 = UTF_uj8_cmpn(uj8a,local_148,sVar4 + 1);
  UTF_test(line,iVar3 == 0);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)(buf + 0xf8));
  return;
}

Assistant:

void u_to_u8_test(int line, const UTF_US16& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_u_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj16_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}